

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O0

void rsg::copyVarying<64>(ValueAccess dst,ConstStridedValueAccess<64> src,int compNdx)

{
  int iVar1;
  deBool dVar2;
  Type TVar3;
  int iVar4;
  VariableType *pVVar5;
  TestError *this;
  float *pfVar6;
  float fVar7;
  ConstStridedValueAccess<1> local_60;
  ConstStridedValueAccess<64> local_50;
  int local_40;
  int elemNdx;
  int local_2c;
  undefined1 auStack_28 [4];
  int compNdx_local;
  ConstStridedValueAccess<64> src_local;
  ValueAccess dst_local;
  
  src_local.m_type = (VariableType *)src.m_value;
  _auStack_28 = src.m_type;
  src_local.m_value = (Scalar *)dst.super_ConstStridedValueAccess<1>.m_type;
  local_2c = compNdx;
  while( true ) {
    dVar2 = deGetFalse();
    if (dVar2 != 0) break;
    pVVar5 = ConstStridedValueAccess<1>::getType((ConstStridedValueAccess<1> *)&src_local.m_value);
    TVar3 = VariableType::getBaseType(pVVar5);
    if (TVar3 != TYPE_FLOAT) break;
    dVar2 = deGetFalse();
    if (dVar2 == 0) {
      local_40 = 0;
      while( true ) {
        iVar1 = local_40;
        pVVar5 = ConstStridedValueAccess<1>::getType
                           ((ConstStridedValueAccess<1> *)&src_local.m_value);
        iVar4 = VariableType::getNumElements(pVVar5);
        if (iVar4 <= iVar1) break;
        local_50 = ConstStridedValueAccess<64>::component
                             ((ConstStridedValueAccess<64> *)auStack_28,local_40);
        fVar7 = ConstStridedValueAccess<64>::asFloat(&local_50,local_2c);
        local_60 = (ConstStridedValueAccess<1>)
                   StridedValueAccess<1>::component
                             ((StridedValueAccess<1> *)&src_local.m_value,local_40);
        pfVar6 = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_60);
        *pfVar6 = fVar7;
        local_40 = local_40 + 1;
      }
      return;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"dst.getType().getBaseType() == VariableType::TYPE_FLOAT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
             ,0xa2);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void copyVarying (ValueAccess dst, ConstStridedValueAccess<Stride> src, int compNdx)
{
	TCU_CHECK(dst.getType().getBaseType() == VariableType::TYPE_FLOAT);
	for (int elemNdx = 0; elemNdx < dst.getType().getNumElements(); elemNdx++)
		dst.component(elemNdx).asFloat() = src.component(elemNdx).asFloat(compNdx);
}